

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_CALLNZ(Context *ctx)

{
  RegisterType RVar1;
  char *in_RDX;
  char *extraout_RDX;
  
  RVar1 = ctx->source_args[1].regtype;
  if ((RVar1 != REG_TYPE_CONSTBOOL) && (RVar1 != REG_TYPE_MAX)) {
    failf(ctx,"%s","CALLNZ argument isn\'t constbool or predicate register");
    in_RDX = extraout_RDX;
  }
  check_label_register(ctx,0x12cbd2,in_RDX);
  check_call_loop_wrappage(ctx,ctx->source_args[0].regnum);
  return;
}

Assistant:

static void state_CALLNZ(Context *ctx)
{
    const RegisterType regtype = ctx->source_args[1].regtype;
    if ((regtype != REG_TYPE_CONSTBOOL) && (regtype != REG_TYPE_PREDICATE))
        fail(ctx, "CALLNZ argument isn't constbool or predicate register");
    check_label_register(ctx, 0, "CALLNZ");
    check_call_loop_wrappage(ctx, ctx->source_args[0].regnum);
}